

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

qpdf_offset_t __thiscall
QPDFWriter::writeXRefTable
          (QPDFWriter *this,trailer_e which,int first,int last,int size,qpdf_offset_t prev,
          bool suppress_offsets,int hint_id,qpdf_offset_t hint_offset,qpdf_offset_t hint_length,
          int linearization_pass)

{
  element_type *peVar1;
  qpdf_offset_t qVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_register_0000000c;
  size_type *__n;
  size_t sVar5;
  void *__buf;
  uint uVar6;
  int __fd;
  long lVar7;
  QUtil *this_00;
  NewObject *this_01;
  Count *pCVar8;
  int iVar9;
  ulong idx;
  uint uVar10;
  uint uVar11;
  long lVar12;
  string local_70;
  int local_4c;
  trailer_e local_48;
  int local_44;
  size_type local_40;
  qpdf_offset_t local_38;
  
  sVar5 = CONCAT44(in_register_0000000c,last);
  local_48 = which;
  local_44 = size;
  local_38 = prev;
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27c05d,(void *)0x5,sVar5);
  uVar6 = -first;
  if (0 < first) {
    uVar6 = first;
  }
  uVar10 = 1;
  if (9 < uVar6) {
    sVar5 = (size_t)uVar6;
    uVar11 = 4;
    do {
      uVar10 = uVar11;
      uVar3 = (uint)sVar5;
      if (uVar3 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_001f3992;
      }
      if (uVar3 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_001f3992;
      }
      if (uVar3 < 10000) goto LAB_001f3992;
      sVar5 = sVar5 / 10000;
      uVar11 = uVar10 + 4;
    } while (99999 < uVar3);
    uVar10 = uVar10 + 1;
  }
LAB_001f3992:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_4c = first;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar10 - (char)(first >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + ((uint)first >> 0x1f),uVar10,uVar6);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_70._M_dataplus._M_p,(void *)local_70._M_string_length,sVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27bca6,(void *)0x1,sVar5);
  uVar10 = (last - local_4c) + 1;
  uVar6 = -uVar10;
  if (0 < (int)uVar10) {
    uVar6 = uVar10;
  }
  uVar11 = 1;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  if (9 < uVar6) {
    sVar5 = (size_t)uVar6;
    uVar3 = 4;
    do {
      uVar11 = uVar3;
      uVar4 = (uint)sVar5;
      if (uVar4 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_001f3a80;
      }
      if (uVar4 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_001f3a80;
      }
      if (uVar4 < 10000) goto LAB_001f3a80;
      sVar5 = sVar5 / 10000;
      uVar3 = uVar11 + 4;
    } while (99999 < uVar4);
    uVar11 = uVar11 + 1;
  }
LAB_001f3a80:
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar11 - (char)((int)uVar10 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uVar10 >> 0x1f),uVar11,uVar6);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_70._M_dataplus._M_p,(void *)local_70._M_string_length,sVar5);
  iVar9 = local_4c;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pCVar8 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           pipeline;
  __n = &pCVar8->str->_M_string_length;
  if (pCVar8->str == (string *)0x0) {
    __n = (size_type *)&pCVar8->count;
  }
  local_40 = *__n;
  ::qpdf::pl::Count::write(pCVar8,0x27be07,(void *)0x1,(size_t)__n);
  if (iVar9 <= last) {
    idx = (ulong)iVar9;
    lVar12 = idx << 5;
    iVar9 = (last - iVar9) + 1;
    do {
      if (idx == 0) {
        pCVar8 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline;
        __buf = (void *)0x14;
        __fd = 0x27be2f;
      }
      else {
        if (suppress_offsets) {
          this_00 = (QUtil *)0x0;
        }
        else {
          peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          lVar7 = *(long *)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                            super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                            .
                            super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                            ._M_impl;
          if (idx < (ulong)((long)*(pointer *)
                                   ((long)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                           super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                           .
                                           super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                   + 8) - lVar7 >> 5)) {
            this_01 = (NewObject *)(lVar7 + lVar12);
          }
          else {
            this_01 = ObjTable<QPDFWriter::NewObject>::large_element
                                (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,idx);
          }
          qVar2 = QPDFXRefEntry::getOffset(&this_01->xref);
          lVar7 = 0;
          if (hint_offset <= qVar2) {
            lVar7 = hint_length;
          }
          __n = (size_type *)0x0;
          if ((long)hint_id == idx) {
            lVar7 = 0;
          }
          if (hint_id == 0) {
            lVar7 = 0;
          }
          this_00 = (QUtil *)(lVar7 + qVar2);
        }
        QUtil::int_to_string_abi_cxx11_(&local_70,this_00,10,(int)__n);
        ::qpdf::pl::Count::write
                  (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pipeline,(int)local_70._M_dataplus._M_p,
                   (void *)local_70._M_string_length,(size_t)__n);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pCVar8 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline;
        __buf = (void *)0xa;
        __fd = 0x27be44;
      }
      ::qpdf::pl::Count::write(pCVar8,__fd,__buf,(size_t)__n);
      idx = idx + 1;
      lVar12 = lVar12 + 0x20;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  sVar5 = 0;
  writeTrailer(this,local_48,local_44,false,local_38,linearization_pass);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27be07,(void *)0x1,sVar5);
  return local_40;
}

Assistant:

qpdf_offset_t
QPDFWriter::writeXRefTable(
    trailer_e which,
    int first,
    int last,
    int size,
    qpdf_offset_t prev,
    bool suppress_offsets,
    int hint_id,
    qpdf_offset_t hint_offset,
    qpdf_offset_t hint_length,
    int linearization_pass)
{
    writeString("xref\n");
    writeString(std::to_string(first));
    writeString(" ");
    writeString(std::to_string(last - first + 1));
    qpdf_offset_t space_before_zero = m->pipeline->getCount();
    writeString("\n");
    for (int i = first; i <= last; ++i) {
        if (i == 0) {
            writeString("0000000000 65535 f \n");
        } else {
            qpdf_offset_t offset = 0;
            if (!suppress_offsets) {
                offset = m->new_obj[i].xref.getOffset();
                if ((hint_id != 0) && (i != hint_id) && (offset >= hint_offset)) {
                    offset += hint_length;
                }
            }
            writeString(QUtil::int_to_string(offset, 10));
            writeString(" 00000 n \n");
        }
    }
    writeTrailer(which, size, false, prev, linearization_pass);
    writeString("\n");
    return space_before_zero;
}